

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void * ZSTD_cwksp_reserve_internal(ZSTD_cwksp *ws,size_t bytes,ZSTD_cwksp_alloc_phase_e phase)

{
  uint uVar1;
  undefined4 in_EDX;
  ZSTD_cwksp *in_RSI;
  undefined8 in_RDI;
  void *alloc;
  undefined4 in_stack_ffffffffffffffe0;
  ZSTD_cwksp *in_stack_fffffffffffffff8;
  void *pvVar2;
  
  ZSTD_cwksp_internal_advance_phase
            (in_stack_fffffffffffffff8,(ZSTD_cwksp_alloc_phase_e)((ulong)in_RDI >> 0x20));
  uVar1 = ZSTD_isError(0x2bd518);
  if ((uVar1 == 0) && (in_RSI != (ZSTD_cwksp *)0x0)) {
    pvVar2 = ZSTD_cwksp_reserve_internal_buffer_space
                       (in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  }
  else {
    pvVar2 = (void *)0x0;
  }
  return pvVar2;
}

Assistant:

MEM_STATIC void*
ZSTD_cwksp_reserve_internal(ZSTD_cwksp* ws, size_t bytes, ZSTD_cwksp_alloc_phase_e phase)
{
    void* alloc;
    if (ZSTD_isError(ZSTD_cwksp_internal_advance_phase(ws, phase)) || bytes == 0) {
        return NULL;
    }

#if ZSTD_ADDRESS_SANITIZER && !defined (ZSTD_ASAN_DONT_POISON_WORKSPACE)
    /* over-reserve space */
    bytes += 2 * ZSTD_CWKSP_ASAN_REDZONE_SIZE;
#endif

    alloc = ZSTD_cwksp_reserve_internal_buffer_space(ws, bytes);

#if ZSTD_ADDRESS_SANITIZER && !defined (ZSTD_ASAN_DONT_POISON_WORKSPACE)
    /* Move alloc so there's ZSTD_CWKSP_ASAN_REDZONE_SIZE unused space on
     * either size. */
    if (alloc) {
        alloc = (BYTE *)alloc + ZSTD_CWKSP_ASAN_REDZONE_SIZE;
        if (ws->isStatic == ZSTD_cwksp_dynamic_alloc) {
            /* We need to keep the redzone poisoned while unpoisoning the bytes that
             * are actually allocated. */
            __asan_unpoison_memory_region(alloc, bytes - 2 * ZSTD_CWKSP_ASAN_REDZONE_SIZE);
        }
    }
#endif

    return alloc;
}